

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O1

bool __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::DoPrepareNextMultiobjSolve
          (MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  ulong uVar1;
  pointer *this_00;
  vector<double,_std::allocator<double>_> *backend;
  int iVar2;
  BasicSolver *pBVar3;
  bool bVar4;
  pair<bool,_mp::sol::Status> pVar5;
  ulong uVar6;
  _Any_data _Stack_98;
  code *local_88;
  _Any_data local_78;
  code *local_68;
  ArgList local_58;
  char *local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  iVar2 = this->i_current_obj_;
  uVar1 = (long)iVar2 + 1;
  this->i_current_obj_ = (int)uVar1;
  uVar6 = ((long)(this->obj_new_).
                 super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->obj_new_).
                 super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715;
  if (uVar6 < uVar1 || uVar6 - uVar1 == 0) {
    this->status_ = FINISHED;
    pBVar3 = (BasicSolver *)
             this[2].obj_new_.
             super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pBVar3->verbose_ == true) {
      local_58.field_1.values_ = (Value *)&local_48;
      local_48 = (char *)0x0;
      uStack_40 = 0;
      local_58.types_ = 0;
      BasicSolver::Print(pBVar3,(CStringRef)0x49eab9,&local_58);
    }
LAB_00427e68:
    bVar4 = false;
  }
  else {
    pBVar3 = (BasicSolver *)
             this[2].obj_new_.
             super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pBVar3->verbose_ == true) {
      local_48 = (char *)(ulong)(iVar2 + 2);
      local_58.field_1.values_ = (Value *)&local_48;
      local_58.types_ = 0x52;
      local_38 = uVar6;
      BasicSolver::Print(pBVar3,(CStringRef)0x49eb28,&local_58);
    }
    if (this->i_current_obj_ != 0) {
      std::function<mp::sol::Status_()>::function((function<mp::sol::Status_()> *)&local_78,get_stt)
      ;
      std::function<mp::Solution_()>::function((function<mp::Solution_()> *)&_Stack_98,get_sol);
      pVar5 = ProcessMOIterationPostsolvedSolution
                        (this,(function<mp::sol::Status_()> *)&local_78,
                         (function<mp::Solution_()> *)&_Stack_98);
      if (local_88 != (code *)0x0) {
        (*local_88)(&_Stack_98,&_Stack_98,__destroy_functor);
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (((ulong)pVar5 & 1) == 0) {
        pBVar3 = (BasicSolver *)
                 this[2].obj_new_.
                 super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pBVar3->verbose_ == true) {
          local_48 = sol::GetStatusName(pVar5.second);
          local_58.field_1.values_ = (Value *)&local_48;
          local_58.types_ = 0x2a;
          local_38 = (ulong)pVar5 >> 0x20;
          BasicSolver::Print(pBVar3,(CStringRef)0x49ebae,&local_58);
        }
      }
      else {
        RestrictLastObjVal(this);
      }
      if (((ulong)pVar5 & 1) == 0) goto LAB_00427e68;
    }
    this_00 = &this[-5].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    backend = &this[7].obj_new_tolr_;
    ConstraintManager::FillConstraintCounters
              ((ConstraintManager *)this_00,(BasicFlatModelAPI *)backend,
               (FlatModelInfo *)this[-1].objval_last_);
    FlatModel<mp::DefaultFlatModelParams>::
    SetObjectiveTo<TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>>
              ((FlatModel<mp::DefaultFlatModelParams> *)&this[-5].obj_new_tolr_,
               (TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
                *)backend,0,
               (this->obj_new_).
               super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
               _M_impl.super__Vector_impl_data._M_start + this->i_current_obj_);
    ConstraintManager::AddUnbridgedConstraintsToBackend
              ((ConstraintManager *)this_00,(BasicFlatModelAPI *)backend,
               (ItemNamer *)&this[-2].i_current_obj_);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool DoPrepareNextMultiobjSolve(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    if (++i_current_obj_ >= obj_new_.size()) {
      status_ = MOManagerStatus::FINISHED;
			if (MPD( GetEnv() ).verbose_mode())
				MPD( GetEnv() ).Print(
							"\n\n"
							"==============================================================================\n"
							"MULTI-OBJECTIVE MODE: done.\n\n");
			return false;                              // all done
    }
    if (MPD( GetEnv() ).verbose_mode())
      MPD( GetEnv() ).Print(
          "\n\n"
          "MULTI-OBJECTIVE MODE: objective {} (out of {}) ...\n"
          "==============================================================================\n\n"
          , i_current_obj_+1, obj_new_.size());
    if (i_current_obj_) {
      auto proc_sol = ProcessMOIterationPostsolvedSolution(get_stt, get_sol);
      if (!proc_sol.first) {
        if (MPD( GetEnv() ).verbose_mode())
          MPD( GetEnv() ).Print(
              "   ... ABORTING: previous iteration's solve result: {} (code {}.)\n"
              "==============================================================================\n\n"
              , sol::GetStatusName(proc_sol.second), proc_sol.second);
        return false;
      }
      RestrictLastObjVal();
    }
    MPD( FillConstraintCounters( MPD( GetModelAPI() ), *MPD( GetModelInfoWrt() ) ) );   // @todo a hack.
    MPD( GetModelAPI() ).InitProblemModificationPhase(   // For adding the new constraint. @todo a hack.
        MPD( GetModelInfo() ));                          // Ideally Model would notice changes and notify
    ReplaceCurrentObj();                  // After allowing model modification (needed by SCIP.)
    MPD( AddUnbridgedConstraintsToBackend(
        MPD( GetModelAPI() ), MPD( GetVarNamer() )) );
    MPD( GetModelAPI() ).FinishProblemModificationPhase();            // ModelAPI automatically.
    return true;
  }